

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kratos_except.cc
# Opt level: O0

void init_except(module *m)

{
  handle local_78;
  handle local_70;
  handle local_68;
  handle local_60;
  handle local_58;
  handle local_50;
  handle local_48;
  handle local_40;
  handle local_28;
  handle local_20;
  handle local_18;
  module_ except_m;
  module *m_local;
  
  except_m.super_object.super_handle.m_ptr = (object)(object)m;
  pybind11::module_::def_submodule((module_ *)&local_18,(char *)m,"exception");
  local_20.m_ptr = local_18.m_ptr;
  pybind11::handle::handle(&local_28,_PyExc_Exception);
  pybind11::register_exception<kratos::VarException>(local_20,"VarException",local_28);
  local_40.m_ptr = local_18.m_ptr;
  pybind11::handle::handle(&local_48,_PyExc_Exception);
  pybind11::register_exception<kratos::StmtException>(local_40,"StmtException",local_48);
  local_50.m_ptr = local_18.m_ptr;
  pybind11::handle::handle(&local_58,_PyExc_Exception);
  pybind11::register_exception<kratos::InternalException>(local_50,"InternalException",local_58);
  local_60.m_ptr = local_18.m_ptr;
  pybind11::handle::handle(&local_68,_PyExc_Exception);
  pybind11::register_exception<kratos::UserException>(local_60,"UserException",local_68);
  local_70.m_ptr = local_18.m_ptr;
  pybind11::handle::handle(&local_78,_PyExc_Exception);
  pybind11::register_exception<kratos::InvalidConversionException>
            (local_70,"InvalidConversionException",local_78);
  pybind11::module_::~module_((module_ *)&local_18);
  return;
}

Assistant:

void init_except(py::module &m) {
    using namespace kratos;
    auto except_m = m.def_submodule("exception");
    py::register_exception<VarException>(except_m, "VarException");
    py::register_exception<StmtException>(except_m, "StmtException");
    py::register_exception<InternalException>(except_m, "InternalException");
    py::register_exception<UserException>(except_m, "UserException");
    py::register_exception<InvalidConversionException>(except_m, "InvalidConversionException");
}